

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin_smoothing.c
# Opt level: O0

int main(int argc,char **argv)

{
  uchar *__ptr;
  void *__ptr_00;
  undefined8 *in_RSI;
  int in_EDI;
  uchar *output_00;
  double end;
  char *filename;
  double elapsed;
  double startTime;
  int apply_skin_filter;
  int smoothingLevel;
  uchar *output;
  uchar *input;
  int channels;
  int height;
  int width;
  char out_file [1024];
  char ext [256];
  char fname [256];
  char dir [256];
  char drive [3];
  char *in_file;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  undefined4 in_stack_fffffffffffff890;
  int in_stack_fffffffffffff894;
  int *in_stack_fffffffffffff898;
  char *in_stack_fffffffffffff8a0;
  undefined4 uVar1;
  undefined4 uVar2;
  char local_728 [1024];
  char local_328 [256];
  char local_228 [256];
  char local_128 [269];
  char local_1b [3];
  char *local_18;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Image Processing \n ");
  printf("blog:http://cpuimage.cnblogs.com/ \n ");
  printf("Skin Smoothing\n ");
  if (local_8 < 2) {
    printf("usage: \n ");
    printf("%s filename \n ",*local_10);
    printf("%s image.jpg \n ",*local_10);
    getchar();
  }
  else {
    local_18 = (char *)local_10[1];
    splitpath(local_18,local_1b,local_128,local_228,local_328);
    sprintf(local_728,"%s%s%s_out.jpg",local_1b,local_128,local_228);
    __ptr = loadImage(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
                      (int *)CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                      (int *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    if (__ptr == (uchar *)0x0) {
      printf("load file: %s fail!\n",local_18);
    }
    else {
      __ptr_00 = calloc(0,1);
      if (__ptr_00 != (void *)0x0) {
        uVar2 = 10;
        uVar1 = 0;
        output_00 = (uchar *)now();
        skinSmoothing((uchar *)CONCAT44(uVar2,uVar1),output_00,
                      (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20),(int)in_stack_fffffffffffff8a0
                      ,(int)((ulong)in_stack_fffffffffffff898 >> 0x20),
                      (int)in_stack_fffffffffffff898,(int)__ptr);
        end = now();
        filename = (char *)calcElapsed((double)output_00,end);
        printf("elapsed time: %d ms.\n ",(ulong)(uint)(int)((double)filename * 1000.0));
        saveImage(filename,(int)((ulong)output_00 >> 0x20),(int)output_00,in_stack_fffffffffffff894,
                  (uchar *)CONCAT44(in_stack_fffffffffffff88c,uVar1));
        free(__ptr_00);
      }
      free(__ptr);
    }
    printf("press any key to exit. \n");
    getchar();
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    printf("Image Processing \n ");
    printf("blog:http://cpuimage.cnblogs.com/ \n ");
    printf("Skin Smoothing\n ");
    if (argc < 2) {
        printf("usage: \n ");
        printf("%s filename \n ", argv[0]);
        printf("%s image.jpg \n ", argv[0]);
        getchar();
        return 0;
    }
    char *in_file = argv[1];
    char drive[3];
    char dir[256];
    char fname[256];
    char ext[256];
    char out_file[1024];
    splitpath(in_file, drive, dir, fname, ext);
    sprintf(out_file, "%s%s%s_out.jpg", drive, dir, fname);
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char *input = NULL;
    input = loadImage(in_file, &width, &height, &channels);
    if (input) {
        unsigned char *output = (unsigned char *) calloc(width * channels * height * sizeof(unsigned char), 1);
        if (output) {
            int smoothingLevel = 10;
            int apply_skin_filter = 0;
            double startTime = now();
            skinSmoothing(input, output, width, height, channels, smoothingLevel, apply_skin_filter);
            double elapsed = calcElapsed(startTime, now());
            printf("elapsed time: %d ms.\n ", (int) (elapsed * 1000));
            saveImage(out_file, width, height, channels, output);
            free(output);
        }
        free(input);
    } else {
        printf("load file: %s fail!\n", in_file);
    }
    printf("press any key to exit. \n");
    getchar();
    return 0;
}